

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseInt32Flag(char *str,char *flag,int32_t *value)

{
  Message *src_text;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  Message *in_stack_ffffffffffffffa0;
  Message local_38;
  char *local_30;
  char *value_str;
  int32_t *value_local;
  char *flag_local;
  char *str_local;
  
  value_str = (char *)value;
  value_local = (int32_t *)flag;
  flag_local = str;
  local_30 = ParseFlagValue(str,flag,false);
  if (local_30 == (char *)0x0) {
    str_local._7_1_ = 0;
  }
  else {
    Message::Message(&local_38);
    Message::operator<<(&local_38,(char (*) [21])"The value of flag --");
    src_text = Message::operator<<(in_stack_ffffffffffffffa0,
                                   (char **)CONCAT17(in_stack_ffffffffffffff9f,
                                                     in_stack_ffffffffffffff98));
    str_local._7_1_ = ParseInt32(src_text,local_30,(int32_t *)value_str);
    Message::~Message((Message *)0x12c911);
  }
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}